

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::VectorDeathTest_BoundsChecks_Test::TestBody
          (VectorDeathTest_BoundsChecks_Test *this)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var9;
  char *in_R9;
  DeathTest *gtest_dt;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  ReturnSentinel gtest_sentinel;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff10;
  AssertHelper local_d0;
  Vector<int> vec;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_90;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  vec.data_ = (int *)0x0;
  vec.size_ = 0;
  vec.capacity_ = 0;
  bVar4 = testing::internal::AlwaysTrue();
  _Var9._M_head_impl = in_stack_ffffffffffffff10._M_head_impl;
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_ffffffffffffff10._M_head_impl);
    bVar4 = testing::internal::DeathTest::Create
                      ("vec.front()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xa9,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_48);
    _Var9._M_head_impl = in_stack_ffffffffffffff10._M_head_impl;
    if (!bVar4) goto LAB_002d4915;
    _Var9._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
    if (_Var9._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar6 = (**(code **)(*(long *)_Var9._M_head_impl + 0x10))(_Var9._M_head_impl);
      if (iVar6 == 0) {
        plVar1 = (long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
        iVar6 = (**(code **)(*plVar1 + 0x18))(plVar1);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        cVar5 = (**(code **)(*plVar1 + 0x20))(plVar1,bVar4);
        if (cVar5 == '\0') {
          (**(code **)(*(long *)_Var9._M_head_impl + 8))(_Var9._M_head_impl);
          _Var9._M_head_impl = in_stack_ffffffffffffff10._M_head_impl;
          goto LAB_002d4915;
        }
      }
      else if (iVar6 == 1) {
        gtest_sentinel.test_ = (DeathTest *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          Vector<int>::front(&vec);
        }
        (**(code **)(*(long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_) + 0x28))
                  ((long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_),2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      lVar8 = *(long *)_Var9._M_head_impl;
      goto LAB_002d4960;
    }
  }
  else {
LAB_002d4915:
    testing::Message::Message((Message *)&stack0xffffffffffffff10);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xa9,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xffffffffffffff10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_ffffffffffffff10._M_head_impl = _Var9._M_head_impl;
    if (_Var9._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar8 = *(long *)_Var9._M_head_impl;
LAB_002d4960:
      (**(code **)(lVar8 + 8))(_Var9._M_head_impl);
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  _Var9._M_head_impl = in_stack_ffffffffffffff10._M_head_impl;
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_ffffffffffffff10._M_head_impl);
    bVar4 = testing::internal::DeathTest::Create
                      ("vec.back()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_60,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xaa,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_60);
    _Var9._M_head_impl = in_stack_ffffffffffffff10._M_head_impl;
    if (!bVar4) goto LAB_002d4a47;
    _Var9._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
    if (_Var9._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar6 = (**(code **)(*(long *)_Var9._M_head_impl + 0x10))(_Var9._M_head_impl);
      if (iVar6 == 0) {
        plVar1 = (long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
        iVar6 = (**(code **)(*plVar1 + 0x18))(plVar1);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        cVar5 = (**(code **)(*plVar1 + 0x20))(plVar1,bVar4);
        if (cVar5 == '\0') {
          (**(code **)(*(long *)_Var9._M_head_impl + 8))(_Var9._M_head_impl);
          _Var9._M_head_impl = in_stack_ffffffffffffff10._M_head_impl;
          goto LAB_002d4a47;
        }
      }
      else if (iVar6 == 1) {
        gtest_sentinel.test_ = (DeathTest *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          Vector<int>::back(&vec);
        }
        (**(code **)(*(long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_) + 0x28))
                  ((long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_),2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      lVar8 = *(long *)_Var9._M_head_impl;
      goto LAB_002d4a92;
    }
  }
  else {
LAB_002d4a47:
    testing::Message::Message((Message *)&stack0xffffffffffffff10);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xaa,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xffffffffffffff10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_ffffffffffffff10._M_head_impl = _Var9._M_head_impl;
    if (_Var9._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar8 = *(long *)_Var9._M_head_impl;
LAB_002d4a92:
      (**(code **)(lVar8 + 8))(_Var9._M_head_impl);
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_ffffffffffffff10._M_head_impl);
    bVar4 = testing::internal::DeathTest::Create
                      ("vec.pop_back()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xab,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    if (!bVar4) goto LAB_002d4b8c;
    plVar1 = (long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
    if (plVar1 != (long *)0x0) {
      iVar6 = (**(code **)(*plVar1 + 0x10))(plVar1);
      if (iVar6 == 0) {
        plVar2 = (long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
        iVar6 = (**(code **)(*plVar2 + 0x18))(plVar2);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        cVar5 = (**(code **)(*plVar2 + 0x20))(plVar2,bVar4);
        if (cVar5 != '\0') goto LAB_002d4b6c;
        iVar6 = 6;
        bVar4 = false;
      }
      else {
        if (iVar6 == 1) {
          gtest_sentinel.test_ = (DeathTest *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
          bVar4 = testing::internal::AlwaysTrue();
          if (bVar4) {
            Vector<int>::pop_back(&vec);
          }
          (**(code **)(*(long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_) + 0x28))
                    ((long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_),2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
        }
LAB_002d4b6c:
        iVar6 = 0;
        bVar4 = true;
      }
      (**(code **)(*plVar1 + 8))(plVar1);
      if ((!bVar4) && (iVar6 != 0)) {
        if (iVar6 != 6) goto LAB_002d4f0c;
        goto LAB_002d4b8c;
      }
    }
  }
  else {
LAB_002d4b8c:
    testing::Message::Message((Message *)&stack0xffffffffffffff10);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xab,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xffffffffffffff10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff10._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff10._M_head_impl + 8))();
    }
  }
  gtest_dt._0_1_ = Vector<int>::Push(&vec,1);
  local_100._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!(bool)gtest_dt._0_1_) {
    testing::Message::Message((Message *)&gtest_sentinel);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff10,(internal *)&gtest_dt,
               (AssertionResult *)"vec.Push(1)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xac,(char *)in_stack_ffffffffffffff10._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_sentinel);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      (*(gtest_sentinel.test_)->_vptr_DeathTest[1])();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_100);
    goto LAB_002d4f0c;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_100);
  bVar4 = testing::internal::AlwaysTrue();
  _Var9._M_head_impl = in_stack_ffffffffffffff10._M_head_impl;
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_ffffffffffffff10._M_head_impl);
    bVar4 = testing::internal::DeathTest::Create
                      ("vec[1]",(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                 *)&local_90,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xae,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_90);
    _Var9._M_head_impl = in_stack_ffffffffffffff10._M_head_impl;
    if (!bVar4) goto LAB_002d4d83;
    _Var9._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
    if (_Var9._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar6 = (**(code **)(*(long *)_Var9._M_head_impl + 0x10))(_Var9._M_head_impl);
      if (iVar6 == 0) {
        plVar1 = (long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
        iVar6 = (**(code **)(*plVar1 + 0x18))(plVar1);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        cVar5 = (**(code **)(*plVar1 + 0x20))(plVar1,bVar4);
        if (cVar5 == '\0') {
          (**(code **)(*(long *)_Var9._M_head_impl + 8))(_Var9._M_head_impl);
          _Var9._M_head_impl = in_stack_ffffffffffffff10._M_head_impl;
          goto LAB_002d4d83;
        }
      }
      else if (iVar6 == 1) {
        gtest_sentinel.test_ = (DeathTest *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4 && vec.size_ < 2) goto LAB_002d4f31;
        (**(code **)(*(long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_) + 0x28))
                  ((long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_),2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      lVar8 = *(long *)_Var9._M_head_impl;
      goto LAB_002d4dce;
    }
  }
  else {
LAB_002d4d83:
    testing::Message::Message((Message *)&stack0xffffffffffffff10);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xae,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xffffffffffffff10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_ffffffffffffff10._M_head_impl = _Var9._M_head_impl;
    if (_Var9._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar8 = *(long *)_Var9._M_head_impl;
LAB_002d4dce:
      (**(code **)(lVar8 + 8))(_Var9._M_head_impl);
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_ffffffffffffff10._M_head_impl);
    bVar4 = testing::internal::DeathTest::Create
                      ("vec[10000]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xb0,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a8);
    if (bVar4) {
      plVar1 = (long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
      if (plVar1 == (long *)0x0) goto LAB_002d4f0c;
      iVar6 = (**(code **)(*plVar1 + 0x10))(plVar1);
      if (iVar6 == 0) {
        plVar2 = (long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
        iVar6 = (**(code **)(*plVar2 + 0x18))(plVar2);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        cVar5 = (**(code **)(*plVar2 + 0x20))(plVar2,bVar4);
        if (cVar5 != '\0') goto LAB_002d4ea7;
        bVar3 = true;
        bVar4 = false;
      }
      else {
        if (iVar6 == 1) {
          gtest_sentinel.test_ = (DeathTest *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_);
          bVar4 = testing::internal::AlwaysTrue();
          if (bVar4 && vec.size_ < 0x2711) {
LAB_002d4f31:
            abort();
          }
          (**(code **)(*(long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_) + 0x28))
                    ((long *)CONCAT71(gtest_dt._1_7_,gtest_dt._0_1_),2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
        }
LAB_002d4ea7:
        bVar4 = true;
        bVar3 = false;
      }
      (**(code **)(*plVar1 + 8))(plVar1);
      if ((bVar4) || (!bVar3)) goto LAB_002d4f0c;
    }
  }
  testing::Message::Message((Message *)&stack0xffffffffffffff10);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_dt,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
             ,0xb0,pcVar7);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_dt,(Message *)&stack0xffffffffffffff10);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )in_stack_ffffffffffffff10._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)in_stack_ffffffffffffff10._M_head_impl + 8))();
  }
LAB_002d4f0c:
  Vector<int>::~Vector(&vec);
  return;
}

Assistant:

TEST(InplaceVectorTest, ComplexType) {
  InplaceVector<std::vector<int>, 4> vec_of_vecs;
  const std::vector<int> data[] = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  vec_of_vecs.CopyFrom(data);
  EXPECT_EQ(Span(vec_of_vecs), Span(data));

  vec_of_vecs.Resize(2);
  EXPECT_EQ(Span(vec_of_vecs), Span(data, 2));

  vec_of_vecs.PushBack({42});
  EXPECT_EQ(3u, vec_of_vecs.size());
  vec_of_vecs.pop_back();
  EXPECT_EQ(2u, vec_of_vecs.size());

  vec_of_vecs.Resize(4);
  EXPECT_EQ(4u, vec_of_vecs.size());
  EXPECT_EQ(vec_of_vecs[0], data[0]);
  EXPECT_EQ(vec_of_vecs[1], data[1]);
  EXPECT_TRUE(vec_of_vecs[2].empty());
  EXPECT_TRUE(vec_of_vecs[3].empty());

  // Copy-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs2 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs2.size());
  EXPECT_EQ(vec_of_vecs2[0], data[0]);
  EXPECT_EQ(vec_of_vecs2[1], data[1]);
  EXPECT_TRUE(vec_of_vecs2[2].empty());
  EXPECT_TRUE(vec_of_vecs2[3].empty());

  // Copy-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs3;
  vec_of_vecs3 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs3.size());
  EXPECT_EQ(vec_of_vecs3[0], data[0]);
  EXPECT_EQ(vec_of_vecs3[1], data[1]);
  EXPECT_TRUE(vec_of_vecs3[2].empty());
  EXPECT_TRUE(vec_of_vecs3[3].empty());

  // Move-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs4 = std::move(vec_of_vecs);
  EXPECT_EQ(4u, vec_of_vecs4.size());
  EXPECT_EQ(vec_of_vecs4[0], data[0]);
  EXPECT_EQ(vec_of_vecs4[1], data[1]);
  EXPECT_TRUE(vec_of_vecs4[2].empty());
  EXPECT_TRUE(vec_of_vecs4[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs.size());
  for (const auto &vec : vec_of_vecs) {
    EXPECT_TRUE(vec.empty());
  }

  // Move-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs5;
  vec_of_vecs5 = std::move(vec_of_vecs4);
  EXPECT_EQ(4u, vec_of_vecs5.size());
  EXPECT_EQ(vec_of_vecs5[0], data[0]);
  EXPECT_EQ(vec_of_vecs5[1], data[1]);
  EXPECT_TRUE(vec_of_vecs5[2].empty());
  EXPECT_TRUE(vec_of_vecs5[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs4.size());
  for (const auto &vec : vec_of_vecs4) {
    EXPECT_TRUE(vec.empty());
  }

  std::vector<int> v = {42};
  vec_of_vecs5.Resize(3);
  EXPECT_TRUE(vec_of_vecs5.TryPushBack(v));
  EXPECT_EQ(v, vec_of_vecs5[3]);
  EXPECT_FALSE(vec_of_vecs5.TryPushBack(v));
}